

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * cJSON_CreateStringArray(char **strings,int count)

{
  cJSON *item;
  cJSON *a;
  cJSON *p;
  cJSON *n;
  size_t i;
  int count_local;
  char **strings_local;
  
  p = (cJSON *)0x0;
  if ((count < 0) || (strings == (char **)0x0)) {
    strings_local = (char **)0x0;
  }
  else {
    strings_local = (char **)cJSON_CreateArray();
    for (n = (cJSON *)0x0; (cJSON *)strings_local != (cJSON *)0x0 && n < (cJSON *)(long)count;
        n = (cJSON *)((long)&n->next + 1)) {
      item = cJSON_CreateString(strings[(long)n]);
      if (item == (cJSON *)0x0) {
        cJSON_Delete((cJSON *)strings_local);
        return (cJSON *)0x0;
      }
      if (n == (cJSON *)0x0) {
        ((cJSON *)strings_local)->child = item;
      }
      else {
        suffix_object(p,item);
      }
      p = item;
    }
    if (((cJSON *)strings_local != (cJSON *)0x0) &&
       (((cJSON *)strings_local)->child != (cJSON *)0x0)) {
      ((cJSON *)strings_local)->child->prev = p;
    }
  }
  return (cJSON *)strings_local;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateStringArray(const char *const *strings, int count)
{
    size_t i = 0;
    cJSON *n = NULL;
    cJSON *p = NULL;
    cJSON *a = NULL;

    if ((count < 0) || (strings == NULL))
    {
        return NULL;
    }

    a = cJSON_CreateArray();

    for (i = 0; a && (i < (size_t)count); i++)
    {
        n = cJSON_CreateString(strings[i]);
        if(!n)
        {
            cJSON_Delete(a);
            return NULL;
        }
        if(!i)
        {
            a->child = n;
        }
        else
        {
            suffix_object(p,n);
        }
        p = n;
    }

    if (a && a->child) {
        a->child->prev = n;
    }
    
    return a;
}